

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O2

wchar_t borg_slot(wchar_t tval,wchar_t sval)

{
  ulong uVar1;
  uint8_t *puVar2;
  ulong uVar3;
  
  puVar2 = &borg_items->iqty;
  uVar1 = 0xffffffffffffffff;
  for (uVar3 = 0; z_info->pack_size != uVar3; uVar3 = uVar3 + 1) {
    if ((((*puVar2 != 0) && (*(uint32_t *)(puVar2 + -0xc) != 0)) && ((uint)puVar2[-4] == tval)) &&
       (((uint)puVar2[-3] == sval &&
        (((wchar_t)uVar1 < L'\0' || (*puVar2 <= borg_items[uVar1 & 0xffffffff].iqty)))))) {
      uVar1 = uVar3 & 0xffffffff;
    }
    puVar2 = puVar2 + 0x388;
  }
  return (wchar_t)uVar1;
}

Assistant:

int borg_slot(int tval, int sval)
{
    int i, n = -1;

    /* Scan the pack */
    for (i = 0; i < z_info->pack_size; i++) {
        borg_item* item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Skip un-aware items */
        if (!item->kind)
            continue;

        /* Require correct tval */
        if (item->tval != tval)
            continue;

        /* Require correct sval */
        if (item->sval != sval)
            continue;

        /* Prefer smallest pile */
        if ((n >= 0) && (item->iqty > borg_items[n].iqty))
            continue;

        /* Prefer largest "pval" (even if smaller pile)*/
        if ((n >= 0) && (item->pval < borg_items[n].pval)
            && (item->iqty > borg_items[n].iqty))
            continue;

        /* Save this item */
        n = i;
    }

    /* Done */
    return (n);
}